

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

IOTHUB_MESSAGE_HANDLE IoTHubMessage_CreateFromByteArray(uchar *byteArray,size_t size)

{
  LOGGER_LOG p_Var1;
  BUFFER_HANDLE pBVar2;
  MAP_HANDLE pMVar3;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  uchar *puStack_38;
  uchar temp;
  uchar *source;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_MESSAGE_HANDLE_DATA *result;
  size_t size_local;
  uchar *byteArray_local;
  
  result = (IOTHUB_MESSAGE_HANDLE_DATA *)size;
  size_local = (size_t)byteArray;
  if ((byteArray == (uchar *)0x0) && (size != 0)) {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
             ,"IoTHubMessage_CreateFromByteArray",0xe8,1,"Invalid argument - byteArray is NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(0x90);
    if (l == (LOGGER_LOG)0x0) {
      source = (uchar *)xlogging_get_log_function();
      if ((LOGGER_LOG)source != (LOGGER_LOG)0x0) {
        (*(code *)source)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                          ,"IoTHubMessage_CreateFromByteArray",0xf0,1,"unable to malloc");
      }
    }
    else {
      l_2._7_1_ = 0;
      memset(l,0,0x90);
      *(undefined4 *)l = 0;
      if (result == (IOTHUB_MESSAGE_HANDLE_DATA *)0x0) {
        puStack_38 = (uchar *)((long)&l_2 + 7);
      }
      else if (size_local == 0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                    ,"IoTHubMessage_CreateFromByteArray",0xff,1,
                    "Attempted to create a Hub Message from a NULL pointer!");
        }
        DestroyMessageData((IOTHUB_MESSAGE_HANDLE_DATA *)l);
        l = (LOGGER_LOG)0x0;
        puStack_38 = (uchar *)0x0;
      }
      else {
        puStack_38 = (uchar *)size_local;
      }
      if (l != (LOGGER_LOG)0x0) {
        pBVar2 = BUFFER_create(puStack_38,(size_t)result);
        *(BUFFER_HANDLE *)(l + 8) = pBVar2;
        if (pBVar2 == (BUFFER_HANDLE)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                      ,"IoTHubMessage_CreateFromByteArray",0x111,1,"BUFFER_create failed");
          }
          DestroyMessageData((IOTHUB_MESSAGE_HANDLE_DATA *)l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          pMVar3 = Map_Create(ValidateAsciiCharactersFilter);
          *(MAP_HANDLE *)(l + 0x10) = pMVar3;
          if (pMVar3 == (MAP_HANDLE)0x0) {
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                        ,"IoTHubMessage_CreateFromByteArray",0x117,1,
                        "Map_Create for properties failed");
            }
            DestroyMessageData((IOTHUB_MESSAGE_HANDLE_DATA *)l);
            l = (LOGGER_LOG)0x0;
          }
        }
      }
    }
  }
  return (IOTHUB_MESSAGE_HANDLE)l;
}

Assistant:

IOTHUB_MESSAGE_HANDLE IoTHubMessage_CreateFromByteArray(const unsigned char* byteArray, size_t size)
{
    IOTHUB_MESSAGE_HANDLE_DATA* result;
    if ((byteArray == NULL) && (size != 0))
    {
        LogError("Invalid argument - byteArray is NULL");
        result = NULL;
    }
    else
    {
        result = (IOTHUB_MESSAGE_HANDLE_DATA*)malloc(sizeof(IOTHUB_MESSAGE_HANDLE_DATA));
        if (result == NULL)
        {
            LogError("unable to malloc");
            /*let it go through*/
        }
        else
        {
            const unsigned char* source;
            unsigned char temp = 0x00;

            memset(result, 0, sizeof(*result));
            result->contentType = IOTHUBMESSAGE_BYTEARRAY;

            if (size != 0)
            {
                if (byteArray == NULL)
                {
                    LogError("Attempted to create a Hub Message from a NULL pointer!");
                    DestroyMessageData(result);
                    result = NULL;
                    source = NULL;
                }
                else
                {
                    source = byteArray;
                }
            }
            else
            {
                source = &temp;
            }
            if (result != NULL)
            {
                if ((result->value.byteArray = BUFFER_create(source, size)) == NULL)
                {
                    LogError("BUFFER_create failed");
                    DestroyMessageData(result);
                    result = NULL;
                }
                else if ((result->properties = Map_Create(ValidateAsciiCharactersFilter)) == NULL)
                {
                    LogError("Map_Create for properties failed");
                    DestroyMessageData(result);
                    result = NULL;
                }
            }
        }
    }
    return result;
}